

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundogroup.cpp
# Opt level: O2

void __thiscall QUndoGroup::removeStack(QUndoGroup *this,QUndoStack *stack)

{
  long lVar1;
  difference_type dVar2;
  long in_FS_OFFSET;
  QUndoStack *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  local_20 = stack;
  dVar2 = QtPrivate::sequential_erase_with_copy<QList<QUndoStack*>,QUndoStack*>
                    ((QList<QUndoStack_*> *)(lVar1 + 0x80),&local_20);
  if (dVar2 != 0) {
    if (local_20 == *(QUndoStack **)(lVar1 + 0x78)) {
      setActiveStack(this,(QUndoStack *)0x0);
    }
    *(undefined8 *)(*(long *)&local_20->field_0x8 + 0xb0) = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUndoGroup::removeStack(QUndoStack *stack)
{
    Q_D(QUndoGroup);

    if (d->stack_list.removeAll(stack) == 0)
        return;
    if (stack == d->active)
        setActiveStack(nullptr);
    stack->d_func()->group = nullptr;
}